

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::pipePageContents(QPDFObjectHandle *this,Pipeline *p)

{
  allocator<char> local_c1;
  string local_c0 [32];
  QPDFObjectHandle local_a0;
  undefined1 local_90 [8];
  string all_description;
  QPDFObjGen local_60;
  string local_58;
  undefined1 local_38 [8];
  string description;
  Pipeline *p_local;
  QPDFObjectHandle *this_local;
  
  description.field_2._8_8_ = p;
  local_60 = getObjGen(this);
  QPDFObjGen::unparse_abi_cxx11_(&local_58,&local_60,' ');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "page object ",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"/Contents",&local_c1);
  getKey(&local_a0,(string *)this);
  pipeContentStreams(&local_a0,(Pipeline *)description.field_2._8_8_,(string *)local_38,
                     (string *)local_90);
  ~QPDFObjectHandle(&local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::pipePageContents(Pipeline* p)
{
    std::string description = "page object " + getObjGen().unparse(' ');
    std::string all_description;
    this->getKey("/Contents").pipeContentStreams(p, description, all_description);
}